

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_status_t linear_hash_update(ion_key_t key,ion_value_t value,linear_hash_table_t *linear_hash)

{
  ion_key_size_t iVar1;
  ion_dictionary_compare_t p_Var2;
  undefined8 bucket_loc;
  byte bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  ion_status_t iVar7;
  ulong uVar8;
  ion_byte_t *key_00;
  ion_byte_t *value_00;
  ion_fpos_t iVar9;
  ion_byte_t aiStack_80 [16];
  undefined1 local_70 [8];
  linear_hash_bucket_t bucket;
  ulong local_40;
  ion_byte_t local_31 [8];
  ion_byte_t record_status;
  
  aiStack_80[0] = '=';
  aiStack_80[1] = 0xf3;
  aiStack_80[2] = '\x10';
  aiStack_80[3] = '\0';
  aiStack_80[4] = '\0';
  aiStack_80[5] = '\0';
  aiStack_80[6] = '\0';
  aiStack_80[7] = '\0';
  iVar6 = insert_hash_to_bucket((ion_byte_t *)key,linear_hash);
  if (iVar6 < linear_hash->next_split) {
    aiStack_80[0] = 'N';
    aiStack_80[1] = 0xf3;
    aiStack_80[2] = '\x10';
    aiStack_80[3] = '\0';
    aiStack_80[4] = '\0';
    aiStack_80[5] = '\0';
    aiStack_80[6] = '\0';
    aiStack_80[7] = '\0';
    iVar6 = hash_to_bucket((ion_byte_t *)key,linear_hash);
  }
  if (iVar6 < linear_hash->bucket_map->current_size) {
    iVar9 = linear_hash->bucket_map->data[iVar6];
  }
  else {
    iVar9 = -1;
  }
  aiStack_80[0] = 'u';
  aiStack_80[1] = 0xf3;
  aiStack_80[2] = '\x10';
  aiStack_80[3] = '\0';
  aiStack_80[4] = '\0';
  aiStack_80[5] = '\0';
  aiStack_80[6] = '\0';
  aiStack_80[7] = '\0';
  bVar3 = linear_hash_get_bucket(iVar9,(linear_hash_bucket_t *)local_70,linear_hash);
  if (bVar3 == 0) {
    key_00 = aiStack_80 +
             (8 - ((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0));
    value_00 = key_00 + -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0);
    local_31[0] = '\0';
    local_40 = 0;
    do {
      bucket_loc = bucket._0_8_;
      bucket.overflow_location = iVar9 + 0x10;
      bVar4 = true;
      do {
        if (!bVar4) {
          if ((int)local_40 == 0) {
            value_00[-8] = 0x9f;
            value_00[-7] = 0xf4;
            value_00[-6] = '\x10';
            value_00[-5] = '\0';
            value_00[-4] = '\0';
            value_00[-3] = '\0';
            value_00[-2] = '\0';
            value_00[-1] = '\0';
            iVar6 = insert_hash_to_bucket((ion_byte_t *)key,linear_hash);
            value_00[-8] = 0xb0;
            value_00[-7] = 0xf4;
            value_00[-6] = '\x10';
            value_00[-5] = '\0';
            value_00[-4] = '\0';
            value_00[-3] = '\0';
            value_00[-2] = '\0';
            value_00[-1] = '\0';
            iVar7 = linear_hash_insert(key,value,iVar6,linear_hash);
            local_40 = (ulong)iVar7 >> 0x20;
            uVar8 = (ulong)(iVar7._0_4_ & 0xffffff00);
          }
          else {
            iVar7.error = '\0';
            iVar7._1_3_ = 0;
            iVar7.count = 0;
            uVar8 = 0;
          }
          goto LAB_0010f466;
        }
        iVar9 = bucket.overflow_location;
        for (iVar6 = 0; iVar6 < linear_hash->records_per_bucket; iVar6 = iVar6 + 1) {
          value_00[-8] = 0xf5;
          value_00[-7] = 0xf3;
          value_00[-6] = '\x10';
          value_00[-5] = '\0';
          value_00[-4] = '\0';
          value_00[-3] = '\0';
          value_00[-2] = '\0';
          value_00[-1] = '\0';
          iVar7.error = linear_hash_get_record(iVar9,key_00,value_00,local_31,linear_hash);
          iVar7._1_7_ = 0;
          if (iVar7.error != 0) goto LAB_0010f460;
          if (local_31[0] == '\x01') {
            iVar1 = (linear_hash->super).record.key_size;
            p_Var2 = (linear_hash->super).compare;
            value_00[-8] = '\f';
            value_00[-7] = 0xf4;
            value_00[-6] = '\x10';
            value_00[-5] = '\0';
            value_00[-4] = '\0';
            value_00[-3] = '\0';
            value_00[-2] = '\0';
            value_00[-1] = '\0';
            cVar5 = (*p_Var2)(key_00,key,iVar1);
            if (cVar5 == '\0') {
              value_00[-8] = '&';
              value_00[-7] = 0xf4;
              value_00[-6] = '\x10';
              value_00[-5] = '\0';
              value_00[-4] = '\0';
              value_00[-3] = '\0';
              value_00[-2] = '\0';
              value_00[-1] = '\0';
              iVar7.error = linear_hash_write_record
                                      (iVar9,key_00,(ion_byte_t *)value,local_31,linear_hash);
              iVar7._1_7_ = 0;
              if (iVar7.error != 0) goto LAB_0010f460;
              local_40 = (ulong)((int)local_40 + 1);
            }
          }
          iVar9 = iVar9 + linear_hash->record_total_size;
        }
        bVar4 = false;
      } while (bucket_loc == -1);
      value_00[-8] = 'X';
      value_00[-7] = 0xf4;
      value_00[-6] = '\x10';
      value_00[-5] = '\0';
      value_00[-4] = '\0';
      value_00[-3] = '\0';
      value_00[-2] = '\0';
      value_00[-1] = '\0';
      iVar7.error = linear_hash_get_bucket(bucket_loc,(linear_hash_bucket_t *)local_70,linear_hash);
      iVar7._1_7_ = 0;
      iVar9 = bucket_loc;
    } while (iVar7.error == 0);
LAB_0010f460:
    uVar8 = 0;
LAB_0010f466:
    bVar3 = iVar7.error;
    uVar8 = local_40 << 0x20 | uVar8;
  }
  else {
    uVar8 = 0;
  }
  return (ion_status_t)(bVar3 | uVar8);
}

Assistant:

ion_status_t
linear_hash_update(
	ion_key_t			key,
	ion_value_t			value,
	linear_hash_table_t *linear_hash
) {
	ion_status_t status = ION_STATUS_INITIALIZE;
	/* get the index of the bucket to read */
	int bucket_idx		= insert_hash_to_bucket(key, linear_hash);

	if (bucket_idx < linear_hash->next_split) {
		bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* get the bucket where the record would be located */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* create a temporary store for records that are read */
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	ion_fpos_t record_loc;

	int				i;
	ion_boolean_t	terminal = boolean_false;

	while (terminal == boolean_false) {
		record_loc = bucket_loc + sizeof(linear_hash_bucket_t);

		for (i = 0; i < linear_hash->records_per_bucket; i++) {
			status.error = linear_hash_get_record(record_loc, record_key, record_value, &record_status, linear_hash);

			if (status.error != err_ok) {
				return status;
			}

			if (record_status == linear_hash_record_status_full) {
				if (linear_hash->super.compare(record_key, key, linear_hash->super.record.key_size) == 0) {
					status.error = linear_hash_write_record(record_loc, record_key, value, &record_status, linear_hash);

					if (status.error != err_ok) {
						return status;
					}

					status.count++;
				}
			}

			record_loc += linear_hash->record_total_size;
		}

		if (bucket.overflow_location == linear_hash_end_of_list) {
			terminal = boolean_true;
		}
		else {
			bucket_loc		= bucket.overflow_location;
			status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

			if (status.error != err_ok) {
				return status;
			}
		}
	}

	if (status.count == 0) {
		status.error = err_item_not_found;
		return linear_hash_insert(key, value, insert_hash_to_bucket(key, linear_hash), linear_hash);
	}
	else {
		status.error = err_ok;
	}

	return status;
}